

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_map.h
# Opt level: O2

pair<eastl::pair<int,_int>_*,_bool> __thiscall
eastl::vector_map<int,_int,_eastl::less<int>,_eastl::allocator>::insert
          (vector_map<int,_int,_eastl::less<int>,_eastl::allocator> *this,value_type *val)

{
  iterator position;
  undefined8 extraout_RDX;
  undefined8 uVar1;
  pair<eastl::pair<int,_int>_*,_bool> pVar2;
  
  position = lower_bound(this,&val->first);
  if ((position == (this->m_base).super_VectorBase<eastl::pair<int,_int>,_eastl::allocator>.mpEnd)
     || (val->first < position->first)) {
    position = vector<eastl::pair<int,_int>,_eastl::allocator>::insert(&this->m_base,position,val);
    uVar1 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
  }
  else {
    uVar1 = 0;
  }
  pVar2._8_8_ = uVar1;
  pVar2.first = position;
  return pVar2;
}

Assistant:

::eastl::pair<iterator, bool> insert(value_type const& val) {
    iterator const i(lower_bound(val.first));

    return (i == end() || m_cmp(val.first, i->first))
        ? ::eastl::make_pair(m_base.insert(i, val), true)
        : ::eastl::make_pair(i, false)
        ;
  }